

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

bool __thiscall miniros::names::Path::startsWith(Path *this,Path *other)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int i;
  ulong uVar5;
  string_view __x;
  string_view __y;
  
  if (this->m_absolute == other->m_absolute) {
    sVar3 = size(other);
    sVar4 = size(this);
    if (sVar3 <= sVar4) {
      uVar5 = 0;
      do {
        sVar3 = size(other);
        bVar1 = sVar3 <= uVar5;
        if (sVar3 <= uVar5) {
          return bVar1;
        }
        __x = view(this,(int)uVar5);
        __y = view(other,(int)uVar5);
        bVar2 = std::operator!=(__x,__y);
        uVar5 = uVar5 + 1;
      } while (!bVar2);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Path::isAbsolute() const
{
  return m_absolute;
}